

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,double kappa,double delta)

{
  double dVar1;
  bool bVar2;
  type pdVar3;
  type prVar4;
  type args_3;
  row_value *prVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double repair_3;
  row_value *var_3;
  double repair_2;
  row_value *var_2;
  undefined1 auStack_c8 [4];
  int i_2;
  double local_b8;
  double repair_1;
  row_value *var_1;
  undefined1 auStack_a0 [4];
  int i_1;
  double local_90;
  double repair;
  row_value *var;
  undefined1 auStack_78 [4];
  int i;
  double local_68;
  double d;
  double old_pi;
  double middle;
  double two;
  double one;
  double delta_local;
  double kappa_local;
  int local_28;
  int r_size_local;
  int selected_local;
  int k_local;
  row_value *it_local;
  bit_array *x_local;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  *this_local;
  
  two = 1.0;
  middle = 2.0;
  old_pi = 1.5;
  one = delta;
  delta_local = kappa;
  kappa_local._4_4_ = r_size;
  local_28 = selected;
  r_size_local = k;
  _selected_local = it;
  it_local = (row_value *)x;
  x_local = (bit_array *)this;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x78),(long)k)
  ;
  d = *pdVar3;
  local_68 = delta_local / (1.0 - delta_local) + one;
  if (local_28 < 0) {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x60),0);
    dVar6 = prVar4->value;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x78),
                        (long)r_size_local);
    *pdVar3 = dVar6 / 2.0 + *pdVar3;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_78,
               "    selected: {}/{} ({})/2 = pi {}\n");
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x60),0);
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x78),
                        (long)r_size_local);
    debug_logger<true>::log<int,int,double,double>
              ((debug_logger<true> *)this,_auStack_78,&local_28,(int *)((long)&kappa_local + 4),
               &prVar4->value,pdVar3);
    for (var._4_4_ = 0; prVar5 = _selected_local, var._4_4_ != kappa_local._4_4_;
        var._4_4_ = var._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)var._4_4_);
      repair = (double)(prVar5 + prVar4->id);
      bit_array_impl::unset((bit_array_impl *)it_local,((row_value *)repair)->column);
      dVar6 = local_68;
      pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                          (long)*(int *)repair);
      *pdVar3 = *pdVar3 - dVar6;
      local_90 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                             *)this,*(int *)((long)repair + 4),(bit_array *)it_local);
      if (local_90 <= 0.0) {
        pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                            (long)*(int *)repair);
        dVar6 = (*pdVar3 + local_90) - local_68;
        pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                            (long)*(int *)repair);
        *pdVar3 = dVar6;
      }
    }
  }
  else if (local_28 + 1 < kappa_local._4_4_) {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_28);
    dVar6 = prVar4->value;
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)(local_28 + 1));
    dVar1 = prVar4->value;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x78),
                        (long)r_size_local);
    *pdVar3 = (dVar6 + dVar1) / 2.0 + *pdVar3;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8,
               "    selected: {}/{} ({}x{})/2 = pi {}\n");
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_28);
    args_3 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)(local_28 + 1));
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x78),
                        (long)r_size_local);
    debug_logger<true>::log<int,int,double,double,double>
              ((debug_logger<true> *)this,_auStack_c8,&local_28,(int *)((long)&kappa_local + 4),
               &prVar4->value,&args_3->value,pdVar3);
    for (var_2._4_4_ = 0; prVar5 = _selected_local, var_2._4_4_ <= local_28;
        var_2._4_4_ = var_2._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)var_2._4_4_);
      prVar5 = prVar5 + prVar4->id;
      bit_array_impl::set((bit_array_impl *)it_local,prVar5->column);
      dVar6 = local_68;
      pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                          (long)prVar5->value);
      *pdVar3 = dVar6 + *pdVar3;
      dVar6 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
              ::local_compute_reduced_cost<baryonyx::bit_array>
                        ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                          *)this,prVar5->column,(bit_array *)it_local);
      if (0.0 <= dVar6) {
        pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                            (long)prVar5->value);
        dVar6 = (*pdVar3 - dVar6) + local_68;
        pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                            (long)prVar5->value);
        *pdVar3 = dVar6;
      }
    }
    for (; prVar5 = _selected_local, var_2._4_4_ != kappa_local._4_4_; var_2._4_4_ = var_2._4_4_ + 1
        ) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)var_2._4_4_);
      prVar5 = prVar5 + prVar4->id;
      bit_array_impl::unset((bit_array_impl *)it_local,prVar5->column);
      dVar6 = local_68;
      pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                          (long)prVar5->value);
      *pdVar3 = *pdVar3 - dVar6;
      dVar6 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
              ::local_compute_reduced_cost<baryonyx::bit_array>
                        ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                          *)this,prVar5->column,(bit_array *)it_local);
      if (dVar6 <= 0.0) {
        pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                            (long)prVar5->value);
        dVar6 = (*pdVar3 + dVar6) - local_68;
        pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                            (long)prVar5->value);
        *pdVar3 = dVar6;
      }
    }
  }
  else {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_28);
    dVar6 = prVar4->value;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x78),
                        (long)r_size_local);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar6;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *pdVar3;
    auVar7 = vfmadd213sd_fma(ZEXT816(0x3ff8000000000000),auVar7,auVar8);
    *pdVar3 = auVar7._0_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_a0,
               "    selected: {}/{} ({})/2 = pi {}\n");
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_28);
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x78),
                        (long)r_size_local);
    debug_logger<true>::log<int,int,double,double>
              ((debug_logger<true> *)this,_auStack_a0,&local_28,(int *)((long)&kappa_local + 4),
               &prVar4->value,pdVar3);
    for (var_1._4_4_ = 0; prVar5 = _selected_local, var_1._4_4_ != kappa_local._4_4_;
        var_1._4_4_ = var_1._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)var_1._4_4_);
      repair_1 = (double)(prVar5 + prVar4->id);
      bit_array_impl::set((bit_array_impl *)it_local,((row_value *)repair_1)->column);
      dVar6 = local_68;
      pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                          (long)*(int *)repair_1);
      *pdVar3 = dVar6 + *pdVar3;
      local_b8 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                             *)this,*(int *)((long)repair_1 + 4),(bit_array *)it_local);
      if (0.0 <= local_b8) {
        pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                            (long)*(int *)repair_1);
        dVar6 = (*pdVar3 - local_b8) + local_68;
        pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x50),
                            (long)*(int *)repair_1);
        *pdVar3 = dVar6;
      }
    }
  }
  bVar2 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                      *)this,r_size_local,(bit_array *)it_local);
  dVar6 = d;
  if (bVar2) {
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x78),
                        (long)r_size_local);
    bVar2 = is_signbit_change<double>(dVar6,*pdVar3);
    return bVar2;
  }
  details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                     ,"436");
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }